

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_switch(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  CHAR_DATA *txt;
  CHAR_DATA *in_RDI;
  CHAR_DATA *victim;
  char buf [4608];
  char arg [4608];
  CHAR_DATA *in_stack_ffffffffffffdbc8;
  char *in_stack_ffffffffffffdbd0;
  CHAR_DATA *in_stack_ffffffffffffdbd8;
  CHAR_DATA *ch_00;
  char *in_stack_ffffffffffffdbe0;
  char local_2418 [4608];
  char local_1218;
  int in_stack_ffffffffffffee1c;
  long in_stack_ffffffffffffee20;
  long in_stack_ffffffffffffee28;
  OBJ_DATA *in_stack_ffffffffffffee30;
  CHAR_DATA *in_stack_ffffffffffffee38;
  char *in_stack_ffffffffffffee40;
  char *in_stack_ffffffffffffffd0;
  CHAR_DATA *in_stack_ffffffffffffffd8;
  
  one_argument(in_stack_ffffffffffffdbd0,(char *)in_stack_ffffffffffffdbc8);
  if (local_1218 == '\0') {
    send_to_char(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbd8);
  }
  else if (in_RDI->desc != (DESCRIPTOR_DATA *)0x0) {
    if (in_RDI->desc->original == (CHAR_DATA *)0x0) {
      txt = get_char_world(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      if (txt == (CHAR_DATA *)0x0) {
        send_to_char((char *)0x0,in_stack_ffffffffffffdbd8);
      }
      else if (txt == in_RDI) {
        send_to_char((char *)txt,in_stack_ffffffffffffdbd8);
      }
      else {
        bVar1 = is_npc(in_stack_ffffffffffffdbc8);
        if (bVar1) {
          bVar1 = is_room_owner(in_stack_ffffffffffffdbc8,(ROOM_INDEX_DATA *)0x59340b);
          if ((((bVar1) || (in_RDI->in_room == txt->in_room)) ||
              (bVar1 = room_is_private(txt->in_room), !bVar1)) ||
             (bVar1 = is_trusted(in_stack_ffffffffffffdbc8,0), bVar1)) {
            if (txt->desc == (DESCRIPTOR_DATA *)0x0) {
              sprintf(local_2418,"$N switches into %s.",txt->short_descr);
              ch_00 = in_RDI;
              get_trust(in_stack_ffffffffffffdbc8);
              wiznet(in_stack_ffffffffffffee40,in_stack_ffffffffffffee38,in_stack_ffffffffffffee30,
                     in_stack_ffffffffffffee28,in_stack_ffffffffffffee20,in_stack_ffffffffffffee1c);
              in_RDI->desc->character = txt;
              in_RDI->desc->original = in_RDI;
              txt->desc = in_RDI->desc;
              txt->pcdata = in_RDI->pcdata;
              in_RDI->desc = (DESCRIPTOR_DATA *)0x0;
              copy_vector(txt->comm,in_RDI->comm);
              txt->lines = in_RDI->lines;
              send_to_char((char *)txt,ch_00);
            }
            else {
              send_to_char((char *)txt,in_stack_ffffffffffffdbd8);
            }
          }
          else {
            send_to_char((char *)txt,in_stack_ffffffffffffdbd8);
          }
        }
        else {
          send_to_char((char *)txt,in_stack_ffffffffffffdbd8);
        }
      }
    }
    else {
      send_to_char(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbd8);
    }
  }
  return;
}

Assistant:

void do_switch(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH], buf[MAX_STRING_LENGTH];
	CHAR_DATA *victim;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Switch into whom?\n\r", ch);
		return;
	}

	if (ch->desc == nullptr)
		return;

	if (ch->desc->original != nullptr)
	{
		send_to_char("You are already switched.\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("Ok.\n\r", ch);
		return;
	}

	if (!is_npc(victim))
	{
		send_to_char("You can only switch into mobiles.\n\r", ch);
		return;
	}

	if (!is_room_owner(ch, victim->in_room)
		&& ch->in_room != victim->in_room
		&& room_is_private(victim->in_room)
		&& !is_trusted(ch, IMPLEMENTOR))
	{
		send_to_char("That character is in a private room.\n\r", ch);
		return;
	}

	if (victim->desc != nullptr)
	{
		send_to_char("Character in use.\n\r", ch);
		return;
	}

	sprintf(buf, "$N switches into %s.", victim->short_descr);
	wiznet(buf, ch, nullptr, WIZ_SWITCHES, WIZ_SECURE, get_trust(ch));

	ch->desc->character = victim;
	ch->desc->original = ch;
	victim->desc = ch->desc;
	victim->pcdata = ch->pcdata;
	ch->desc = nullptr;
	/* change communications to match */
	/*
	if (ch->prompt != nullptr)
		victim->prompt = palloc_string(ch->prompt);
	*/

	copy_vector(victim->comm, ch->comm);
	victim->lines = ch->lines;

	send_to_char("Ok.\n\r", victim);
}